

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool __thiscall
caffe::PoolingParameter::MergePartialFromCodedStream(PoolingParameter *this,CodedInputStream *input)

{
  uint tag_00;
  CodedInputStream *input_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  UnknownFieldSet *pUVar5;
  bool local_91;
  PoolingParameter_Engine local_7c;
  PoolingParameter_PoolMethod local_78;
  int value_1;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  PoolingParameter *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x10000604 = input;
LAB_0079d84b:
  do {
    _first_byte_or_zero = stack0xffffffffffffff98;
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    if ((stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) &&
       (tag_2 = (uint32)*stack0xffffffffffffff98->buffer_,
       '\0' < (char)*stack0xffffffffffffff98->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
      google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
      local_91 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_91;
      pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    else {
      local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback
                              (stack0xffffffffffffff98,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    value._0_1_ = (undefined1)uStack_c;
    value_1 = local_10;
    p.first = value_1;
    if ((uStack_c & 1) == 0) goto switchD_0079da77_default;
    iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    switch(iVar2) {
    case 1:
      if ((p.first & 0xff) == 8) {
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (stack0xffffffffffffff98,(int *)&local_78);
        if (!bVar1) {
          return false;
        }
        bVar1 = PoolingParameter_PoolMethod_IsValid(local_78);
        if (bVar1) {
          set_pool(this,local_78);
        }
        else {
          pUVar5 = mutable_unknown_fields(this);
          google::protobuf::UnknownFieldSet::AddVarint(pUVar5,1,(long)(int)local_78);
        }
        goto LAB_0079d84b;
      }
      break;
    case 2:
      if ((p.first & 0xff) != 0x10) break;
      set_has_kernel_size(this);
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                        (stack0xffffffffffffff98,&this->kernel_size_);
      goto joined_r0x0079dd9d;
    case 3:
      if ((p.first & 0xff) == 0x18) {
        set_has_stride(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (stack0xffffffffffffff98,&this->stride_);
        goto joined_r0x0079dd9d;
      }
      break;
    case 4:
      if ((p.first & 0xff) == 0x20) {
        set_has_pad(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (stack0xffffffffffffff98,&this->pad_);
        goto joined_r0x0079dd9d;
      }
      break;
    case 5:
      if ((p.first & 0xff) == 0x28) {
        set_has_kernel_h(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (stack0xffffffffffffff98,&this->kernel_h_);
        goto joined_r0x0079dd9d;
      }
      break;
    case 6:
      if ((p.first & 0xff) == 0x30) {
        set_has_kernel_w(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (stack0xffffffffffffff98,&this->kernel_w_);
        goto joined_r0x0079dd9d;
      }
      break;
    case 7:
      if ((p.first & 0xff) == 0x38) {
        set_has_stride_h(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (stack0xffffffffffffff98,&this->stride_h_);
        goto joined_r0x0079dd9d;
      }
      break;
    case 8:
      if ((p.first & 0xff) == 0x40) {
        set_has_stride_w(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (stack0xffffffffffffff98,&this->stride_w_);
        goto joined_r0x0079dd9d;
      }
      break;
    case 9:
      if ((p.first & 0xff) == 0x48) {
        set_has_pad_h(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (stack0xffffffffffffff98,&this->pad_h_);
        goto joined_r0x0079dd9d;
      }
      break;
    case 10:
      if ((p.first & 0xff) == 0x50) {
        set_has_pad_w(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          (stack0xffffffffffffff98,&this->pad_w_);
        goto joined_r0x0079dd9d;
      }
      break;
    case 0xb:
      if ((p.first & 0xff) == 0x58) {
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (stack0xffffffffffffff98,(int *)&local_7c);
        if (!bVar1) {
          return false;
        }
        bVar1 = PoolingParameter_Engine_IsValid(local_7c);
        if (bVar1) {
          set_engine(this,local_7c);
        }
        else {
          pUVar5 = mutable_unknown_fields(this);
          google::protobuf::UnknownFieldSet::AddVarint(pUVar5,0xb,(long)(int)local_7c);
        }
        goto LAB_0079d84b;
      }
      break;
    case 0xc:
      if ((p.first & 0xff) == 0x60) {
        set_has_global_pooling(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (stack0xffffffffffffff98,&this->global_pooling_);
        goto joined_r0x0079dd9d;
      }
    }
switchD_0079da77_default:
    if ((p.first == 0) ||
       (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(p.first),
       input_00 = stack0xffffffffffffff98, tag_00 = p.first, WVar3 == WIRETYPE_END_GROUP)) {
      return true;
    }
    pUVar5 = mutable_unknown_fields(this);
    bVar1 = google::protobuf::internal::WireFormat::SkipField(input_00,tag_00,pUVar5);
joined_r0x0079dd9d:
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool PoolingParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.PoolingParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .caffe.PoolingParameter.PoolMethod pool = 1 [default = MAX];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::PoolingParameter_PoolMethod_IsValid(value)) {
            set_pool(static_cast< ::caffe::PoolingParameter_PoolMethod >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 kernel_size = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_kernel_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &kernel_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 stride = 3 [default = 1];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_stride();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &stride_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 pad = 4 [default = 0];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_pad();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &pad_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 kernel_h = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_kernel_h();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &kernel_h_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 kernel_w = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          set_has_kernel_w();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &kernel_w_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 stride_h = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_stride_h();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &stride_h_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 stride_w = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(64u)) {
          set_has_stride_w();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &stride_w_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 pad_h = 9 [default = 0];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {
          set_has_pad_h();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &pad_h_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 pad_w = 10 [default = 0];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_pad_w();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &pad_w_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PoolingParameter.Engine engine = 11 [default = DEFAULT];
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::PoolingParameter_Engine_IsValid(value)) {
            set_engine(static_cast< ::caffe::PoolingParameter_Engine >(value));
          } else {
            mutable_unknown_fields()->AddVarint(11, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool global_pooling = 12 [default = false];
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {
          set_has_global_pooling();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &global_pooling_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.PoolingParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.PoolingParameter)
  return false;
#undef DO_
}